

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::translateArguments
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *arguments,
          CoherentFlags *lvalueCoherentFlags)

{
  TOperator TVar1;
  ulong uVar2;
  Id id;
  CoherentFlags *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  CoherentFlags CVar6;
  Decoration decoration;
  undefined4 extraout_var;
  long *plVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  TType *pTVar12;
  TGlslangToSpvTraverser *this_01;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  iterator iVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  Id lvalue_id;
  Id local_10c;
  Builder *local_108;
  ulong local_100;
  TGlslangToSpvTraverser *local_f8;
  CoherentFlags *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  Id *local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  TIntermAggregate *local_98;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_90;
  CoherentFlags local_88 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  long lVar7;
  
  local_f0 = lvalueCoherentFlags;
  iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(node);
  lVar7 = CONCAT44(extraout_var,iVar4);
  TVar1 = (node->super_TIntermOperator).op;
  bVar17 = false;
  bVar18 = false;
  uVar13 = 0;
  if (TVar1 - EOpTextureQuerySize < 0x3c || TVar1 - EOpImageQuerySize < 0x15) {
    plVar8 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar7 + 8) + 0x18))();
    plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
    puVar9 = (uint *)(**(code **)(*plVar8 + 0x40))(plVar8);
    uVar13 = *puVar9;
    bVar17 = (uVar13 & 0x3ff00) == 0x30400;
    if ((uVar13 >> 0x11 & 1) == 0) {
      bVar18 = false;
    }
    else {
      plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
      plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
      iVar4 = (**(code **)(*plVar8 + 0x38))(plVar8);
      bVar18 = iVar4 == 3;
    }
  }
  if ((int)((ulong)(*(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8)) >> 3) < 1) {
    return;
  }
  local_108 = &this->builder;
  local_d0 = (ulong)((uVar13 >> 0x11 & 1) == 0);
  local_c0 = 4 - local_d0;
  local_d0 = local_d0 ^ 3;
  uVar14 = 0;
  local_d8 = (ulong)((uVar13 >> 0x12 & 1) != 0) + 2;
  local_a0 = &(this->builder).accessChain.indexChain;
  local_a8 = &(this->builder).accessChain.swizzle;
  local_e0 = (ulong)bVar18;
  local_e8 = local_e0 + 2;
  local_100 = local_e0 + 3;
  local_b8 = local_e0 + 4;
  local_c8 = local_e0 + 5;
  local_e0 = local_e0 | 6;
  local_b0 = &(this->builder).accessChain.component;
  lVar15 = -4;
  local_f8 = this;
  local_98 = node;
  local_90 = (vector<unsigned_int,std::allocator<unsigned_int>> *)arguments;
LAB_003befea:
  spv::Builder::clearAccessChain(local_108);
  plVar8 = *(long **)(*(long *)(lVar7 + 8) + uVar14 * 8);
  (**(code **)(*plVar8 + 0x10))(plVar8,this);
  TVar1 = (node->super_TIntermOperator).op;
  iVar4 = (int)uVar14;
  switch(TVar1) {
  case EOpImageAtomicAdd:
  case EOpImageAtomicMin:
  case EOpImageAtomicMax:
  case EOpImageAtomicAnd:
  case EOpImageAtomicOr:
  case EOpImageAtomicXor:
  case EOpImageAtomicExchange:
  case EOpImageAtomicCompSwap:
  case EOpImageAtomicLoad:
  case EOpImageAtomicStore:
    if (uVar14 == 0) goto LAB_003bf284;
    goto LAB_003bf181;
  case EOpSubpassLoad:
  case EOpSubpassLoadMS:
  case EOpColorAttachmentReadEXT:
  case EOpImageGuardEnd:
  case EOpTextureGuardBegin:
  case EOpTextureQuerySize:
  case EOpTextureQueryLod:
  case EOpTextureQueryLevels:
  case EOpTextureQuerySamples:
  case EOpSamplingGuardBegin:
  case EOpTexture:
  case EOpTextureProj:
  case EOpTextureLod:
  case EOpTextureOffset:
  case EOpTextureFetch:
  case EOpTextureFetchOffset:
  case EOpTextureProjOffset:
  case EOpTextureLodOffset:
  case EOpTextureProjLod:
  case EOpTextureProjLodOffset:
  case EOpTextureGrad:
  case EOpTextureGradOffset:
  case EOpTextureProjGrad:
  case EOpTextureProjGradOffset:
  case EOpTextureGather:
  case EOpTextureGatherOffset:
  case EOpTextureGatherOffsets:
  case EOpTextureClamp:
  case EOpTextureOffsetClamp:
  case EOpTextureGradClamp:
  case EOpTextureGradOffsetClamp:
  case EOpTextureGatherLod:
  case EOpTextureGatherLodOffset:
  case EOpTextureGatherLodOffsets:
  case EOpFragmentMaskFetch:
  case EOpFragmentFetch:
  case EOpSparseTextureGuardBegin:
  case EOpSparseTexelsResident:
  case EOpSparseTextureGuardEnd:
  case EOpImageFootprintGuardBegin:
    goto switchD_003bf026_caseD_200;
  case EOpSparseImageLoad:
    uVar2 = local_d8;
    break;
  case EOpSparseImageLoadLod:
  case EOpSparseTextureGatherLod:
switchD_003bf026_caseD_203:
    if (iVar4 != 0) {
      if (iVar4 == 3) goto LAB_003bf284;
      goto LAB_003bf181;
    }
    goto LAB_003bf21f;
  case EOpSparseTexture:
    uVar2 = local_e8;
    if (bVar17) goto switchD_003bf026_caseD_203;
    break;
  case EOpSparseTextureLod:
  case EOpSparseTextureOffset:
    goto switchD_003bf026_caseD_228;
  case EOpSparseTextureFetch:
    bVar18 = uVar14 == 3;
    bVar19 = uVar14 == 2;
    goto LAB_003bf13e;
  case EOpSparseTextureFetchOffset:
    bVar18 = uVar14 == 4;
    bVar19 = uVar14 == 3;
LAB_003bf13e:
    bVar3 = (uVar13 >> 8 & 0xff) == 5;
    if ((!(bool)(!bVar3 & bVar18)) && (!(bool)(bVar3 & bVar19))) goto switchD_003bf026_caseD_200;
    goto LAB_003bf284;
  case EOpSparseTextureLodOffset:
  case EOpSparseTextureGrad:
  case EOpSparseTextureOffsetClamp:
    uVar2 = local_b8;
    break;
  case EOpSparseTextureGradOffset:
  case EOpSparseTextureGradClamp:
    uVar2 = local_c8;
    break;
  case EOpSparseTextureGather:
    uVar2 = local_d0;
    break;
  case EOpSparseTextureGatherOffset:
  case EOpSparseTextureGatherOffsets:
    uVar2 = local_c0;
    break;
  case EOpSparseTextureClamp:
    if (bVar17) goto switchD_003bf026_caseD_238;
    goto switchD_003bf026_caseD_228;
  case EOpSparseTextureGradOffsetClamp:
    uVar2 = local_e0;
    break;
  case EOpSparseTextureGatherLodOffset:
  case EOpSparseTextureGatherLodOffsets:
  case EOpImageSampleFootprintNV:
switchD_003bf026_caseD_238:
    if (iVar4 != 0) {
      if (iVar4 == 4) goto LAB_003bf284;
      goto LAB_003bf181;
    }
    goto LAB_003bf21f;
  case EOpImageSampleFootprintClampNV:
  case EOpImageSampleFootprintLodNV:
    if (iVar4 != 0) {
      if (iVar4 == 5) goto LAB_003bf284;
      goto LAB_003bf181;
    }
    goto LAB_003bf21f;
  case EOpImageSampleFootprintGradNV:
    if (iVar4 != 0) {
      if (iVar4 == 6) goto LAB_003bf284;
      goto LAB_003bf181;
    }
    goto LAB_003bf21f;
  case EOpImageSampleFootprintGradClampNV:
    if (iVar4 != 0) {
      if (iVar4 == 7) goto LAB_003bf284;
      goto LAB_003bf181;
    }
    goto LAB_003bf21f;
  default:
    uVar5 = TVar1 - EOpRayQueryGetIntersectionTriangleVertexPositionsEXT;
    if ((0x11 < uVar5) || ((0x30001U >> (uVar5 & 0x1f) & 1) == 0)) goto switchD_003bf026_caseD_200;
    if (iVar4 != 0) {
      if (iVar4 == 2) goto LAB_003bf284;
      goto LAB_003bf181;
    }
    goto LAB_003bf21f;
  }
joined_r0x003bf120:
  if (uVar2 == uVar14) {
LAB_003bf284:
    local_10c = spv::Builder::accessChainGetLValue(local_108);
    iVar16._M_current = *(uint **)((long)arguments + 8);
    if (iVar16._M_current == *(uint **)((long)arguments + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)arguments,iVar16,&local_10c);
    }
    else {
      *iVar16._M_current = local_10c;
      *(uint **)((long)arguments + 8) = iVar16._M_current + 1;
    }
    local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,local_a0);
    local_68 = (this->builder).accessChain.instr;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,local_a8);
    local_38 = *(undefined2 *)(local_b0 + 4);
    local_48 = *(undefined8 *)local_b0;
    uStack_40 = *(undefined8 *)(local_b0 + 2);
    *(undefined2 *)local_f0 = local_38;
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    this_00 = local_f0;
    this = local_f8;
    id = local_10c;
    decoration = TranslateNonUniformDecoration(local_f8,(CoherentFlags *)(ulong)(uint)*local_f0);
    pTVar12 = (TType *)(ulong)id;
    spv::Builder::addDecoration(local_108,id,decoration,-1);
    plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x18))();
    this_01 = (TGlslangToSpvTraverser *)(**(code **)(*plVar8 + 0xf0))(plVar8);
    CVar6 = TranslateCoherent(this_01,pTVar12);
    local_88[0]._0_2_ = CVar6._0_2_;
    spv::Builder::AccessChain::CoherentFlags::operator|=(this_00,local_88);
    node = local_98;
    arguments = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90;
  }
  else {
switchD_003bf026_caseD_200:
    if (uVar14 == 0) {
LAB_003bf21f:
      plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x18))();
      pTVar12 = (TType *)(**(code **)(*plVar8 + 0xf0))(plVar8);
      CVar6 = (CoherentFlags)accessChainLoad(this,pTVar12);
      iVar16._M_current = *(uint **)((long)arguments + 8);
      local_88[0] = CVar6;
      if (iVar16._M_current == *(uint **)((long)arguments + 0x10)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (arguments,iVar16,(uint *)local_88);
        goto LAB_003bf3d7;
      }
    }
    else {
LAB_003bf181:
      lVar10 = (**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x60))();
      if ((lVar10 == 0) ||
         (lVar10 = (**(code **)(**(long **)(*(long *)(lVar7 + 8) + -8 + uVar14 * 8) + 0x60))(),
         lVar10 == 0)) goto LAB_003bf21f;
      plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar14 * 8) + 0x60))();
      lVar10 = (**(code **)(*plVar8 + 0x180))(plVar8);
      plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + -8 + uVar14 * 8) + 0x60))();
      lVar11 = (**(code **)(*plVar8 + 0x180))(plVar8);
      this = local_f8;
      if (lVar10 != lVar11) goto LAB_003bf21f;
      iVar16._M_current = *(uint **)((long)arguments + 8);
      if (iVar16._M_current == *(uint **)((long)arguments + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)arguments,iVar16,
                   (uint *)(*(long *)arguments + lVar15));
        goto LAB_003bf3d7;
      }
      CVar6 = *(CoherentFlags *)(*(long *)arguments + -4 + uVar14 * 4);
    }
    *iVar16._M_current = (uint)CVar6;
    *(CoherentFlags **)((long)arguments + 8) = (CoherentFlags *)iVar16._M_current + 1;
  }
LAB_003bf3d7:
  uVar14 = uVar14 + 1;
  lVar15 = lVar15 + 4;
  if ((long)(int)((ulong)(*(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8)) >> 3) <= (long)uVar14) {
    return;
  }
  goto LAB_003befea;
switchD_003bf026_caseD_228:
  uVar2 = local_100;
  goto joined_r0x003bf120;
}

Assistant:

void TGlslangToSpvTraverser::translateArguments(const glslang::TIntermAggregate& node, std::vector<spv::Id>& arguments,
    spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags)
{
    const glslang::TIntermSequence& glslangArguments = node.getSequence();

    glslang::TSampler sampler = {};
    bool cubeCompare = false;
    bool f16ShadowCompare = false;
    if (node.isTexture() || node.isImage()) {
        sampler = glslangArguments[0]->getAsTyped()->getType().getSampler();
        cubeCompare = sampler.dim == glslang::EsdCube && sampler.arrayed && sampler.shadow;
        f16ShadowCompare = sampler.shadow &&
            glslangArguments[1]->getAsTyped()->getType().getBasicType() == glslang::EbtFloat16;
    }

    for (int i = 0; i < (int)glslangArguments.size(); ++i) {
        builder.clearAccessChain();
        glslangArguments[i]->traverse(this);

        // Special case l-value operands
        bool lvalue = false;
        switch (node.getOp()) {
        case glslang::EOpImageAtomicAdd:
        case glslang::EOpImageAtomicMin:
        case glslang::EOpImageAtomicMax:
        case glslang::EOpImageAtomicAnd:
        case glslang::EOpImageAtomicOr:
        case glslang::EOpImageAtomicXor:
        case glslang::EOpImageAtomicExchange:
        case glslang::EOpImageAtomicCompSwap:
        case glslang::EOpImageAtomicLoad:
        case glslang::EOpImageAtomicStore:
            if (i == 0)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoad:
            if ((sampler.ms && i == 3) || (! sampler.ms && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTexture:
            if (((cubeCompare || f16ShadowCompare) && i == 3) || (! (cubeCompare || f16ShadowCompare) && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureClamp:
            if (((cubeCompare || f16ShadowCompare) && i == 4) || (! (cubeCompare || f16ShadowCompare) && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLod:
        case glslang::EOpSparseTextureOffset:
            if  ((f16ShadowCompare && i == 4) || (! f16ShadowCompare && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetch:
            if ((sampler.dim != glslang::EsdRect && i == 3) || (sampler.dim == glslang::EsdRect && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetchOffset:
            if ((sampler.dim != glslang::EsdRect && i == 4) || (sampler.dim == glslang::EsdRect && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLodOffset:
        case glslang::EOpSparseTextureGrad:
        case glslang::EOpSparseTextureOffsetClamp:
            if ((f16ShadowCompare && i == 5) || (! f16ShadowCompare && i == 4))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffset:
        case glslang::EOpSparseTextureGradClamp:
            if ((f16ShadowCompare && i == 6) || (! f16ShadowCompare && i == 5))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffsetClamp:
            if ((f16ShadowCompare && i == 7) || (! f16ShadowCompare && i == 6))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGather:
            if ((sampler.shadow && i == 3) || (! sampler.shadow && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherOffset:
        case glslang::EOpSparseTextureGatherOffsets:
            if ((sampler.shadow && i == 4) || (! sampler.shadow && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLodOffset:
        case glslang::EOpSparseTextureGatherLodOffsets:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoadLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintNV:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintClampNV:
        case glslang::EOpImageSampleFootprintLodNV:
            if (i == 5)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradNV:
            if (i == 6)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradClampNV:
            if (i == 7)
                lvalue = true;
            break;
        case glslang::EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
        case glslang::EOpRayQueryGetIntersectionLSSPositionsNV:
        case glslang::EOpRayQueryGetIntersectionLSSRadiiNV:
            if (i == 2)
                lvalue = true;
            break;
        default:
            break;
        }

        if (lvalue) {
            spv::Id lvalue_id = builder.accessChainGetLValue();
            arguments.push_back(lvalue_id);
            lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
            builder.addDecoration(lvalue_id, TranslateNonUniformDecoration(lvalueCoherentFlags));
            lvalueCoherentFlags |= TranslateCoherent(glslangArguments[i]->getAsTyped()->getType());
        } else {
            if (i > 0 &&
                glslangArguments[i]->getAsSymbolNode() && glslangArguments[i-1]->getAsSymbolNode() &&
                glslangArguments[i]->getAsSymbolNode()->getId() == glslangArguments[i-1]->getAsSymbolNode()->getId()) {
                // Reuse the id if possible
                arguments.push_back(arguments[i-1]);
            } else {
                arguments.push_back(accessChainLoad(glslangArguments[i]->getAsTyped()->getType()));
            }
        }
    }
}